

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O3

void duckdb::ValidityScan
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result)

{
  pointer pSVar1;
  ulong input_start;
  
  Vector::Flatten(result,scan_count);
  input_start = state->row_index - (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  if ((input_start & 0x3f) != 0) {
    ValidityScanPartial(segment,state,scan_count,result,0);
    return;
  }
  pSVar1 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar1 + 3));
  ValidityUncompressed::AlignedScan
            ((data_ptr_t)(pSVar1[3]._vptr_SegmentScanState[2] + segment->offset),input_start,result,
             scan_count);
  return;
}

Assistant:

void ValidityScan(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result) {
	result.Flatten(scan_count);

	auto start = segment.GetRelativeIndex(state.row_index);
	if (start % ValidityMask::BITS_PER_VALUE == 0) {
		auto &scan_state = state.scan_state->Cast<ValidityScanState>();

		auto buffer_ptr = scan_state.handle.Ptr() + segment.GetBlockOffset();
		D_ASSERT(scan_state.block_id == segment.block->BlockId());
		ValidityUncompressed::AlignedScan(buffer_ptr, start, result, scan_count);
	} else {
		// unaligned scan: fall back to scan_partial which does bitshift tricks
		ValidityScanPartial(segment, state, scan_count, result, 0);
	}
}